

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O3

void __thiscall llvm::yaml::Stream::~Stream(Stream *this)

{
  Document *pDVar1;
  _Head_base<0UL,_llvm::yaml::Scanner_*,_false> __ptr_00;
  pointer *__ptr;
  
  pDVar1 = (this->CurrentDoc)._M_t.
           super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>.
           _M_t.
           super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
           .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl;
  if (pDVar1 != (Document *)0x0) {
    std::
    _Rb_tree<llvm::StringRef,_std::pair<const_llvm::StringRef,_llvm::StringRef>,_std::_Select1st<std::pair<const_llvm::StringRef,_llvm::StringRef>_>,_std::less<llvm::StringRef>,_std::allocator<std::pair<const_llvm::StringRef,_llvm::StringRef>_>_>
    ::~_Rb_tree(&(pDVar1->TagMap)._M_t);
    BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::~BumpPtrAllocatorImpl
              (&pDVar1->NodeAllocator);
    operator_delete(pDVar1,0xa8);
  }
  (this->CurrentDoc)._M_t.
  super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>._M_t.
  super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>.
  super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl = (Document *)0x0;
  __ptr_00._M_head_impl =
       (this->scanner)._M_t.
       super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>._M_t.
       super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>.
       super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>._M_head_impl;
  if (__ptr_00._M_head_impl != (Scanner *)0x0) {
    std::default_delete<llvm::yaml::Scanner>::operator()
              ((default_delete<llvm::yaml::Scanner> *)this,__ptr_00._M_head_impl);
  }
  (this->scanner)._M_t.
  super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>._M_t.
  super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>.
  super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>._M_head_impl = (Scanner *)0x0;
  return;
}

Assistant:

Stream::~Stream() = default;